

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O2

uv_handle_type uv_pipe_pending_type(uv_pipe_t *handle)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int aiStack_128 [2];
  sockaddr asStack_120 [8];
  stat sStack_a0;
  
  if ((handle->ipc == 0) || (iVar3 = handle->accepted_fd, iVar3 == -1)) {
    return UV_UNKNOWN_HANDLE;
  }
  if (iVar3 < 0) {
    return UV_UNKNOWN_HANDLE;
  }
  iVar1 = isatty(iVar3);
  if (iVar1 == 0) {
    iVar1 = fstat(iVar3,&sStack_a0);
    if (iVar1 != 0) {
      return UV_UNKNOWN_HANDLE;
    }
    uVar2 = sStack_a0.st_mode & 0xf000;
    if ((short)uVar2 == -0x4000) {
      aiStack_128[1] = 0x80;
      iVar1 = getsockname(iVar3,asStack_120,(socklen_t *)(aiStack_128 + 1));
      if (iVar1 != 0) {
        return UV_UNKNOWN_HANDLE;
      }
      aiStack_128[1] = 4;
      iVar3 = getsockopt(iVar3,1,3,aiStack_128,(socklen_t *)(aiStack_128 + 1));
      if (iVar3 != 0) {
        return UV_UNKNOWN_HANDLE;
      }
      if (aiStack_128[0] == 1) {
        if ((asStack_120[0].sa_family & 0xfff7) == 2) {
          return UV_TCP;
        }
        if (asStack_120[0].sa_family == 1) {
          return UV_NAMED_PIPE;
        }
      }
      else if ((aiStack_128[0] == 2) && ((asStack_120[0].sa_family & 0xfff7) == 2)) {
        return UV_UDP;
      }
    }
    else {
      if (uVar2 == 0x2000) {
        return UV_FILE;
      }
      if (uVar2 == 0x8000) {
        return UV_FILE;
      }
      if (uVar2 == 0x1000) {
        return UV_NAMED_PIPE;
      }
    }
    return UV_UNKNOWN_HANDLE;
  }
  return UV_TTY;
}

Assistant:

uv_handle_type uv_pipe_pending_type(uv_pipe_t* handle) {
  if (!handle->ipc)
    return UV_UNKNOWN_HANDLE;

  if (handle->accepted_fd == -1)
    return UV_UNKNOWN_HANDLE;
  else
    return uv_guess_handle(handle->accepted_fd);
}